

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O3

err_t bakeBMQVRunA(octet *key,bign_params *params,bake_settings *settings,octet *privkeya,
                  bake_cert *certa,bake_cert *certb,read_i read,write_i write,void *file)

{
  size_t l;
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  octet *in;
  ulong uVar4;
  octet *state;
  octet *poVar5;
  size_t local_48;
  octet *local_40;
  bake_cert *local_38;
  
  bVar1 = memIsValid(key,0x20);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    l = params->l;
    if (((l == 0x80) || (l == 0x100)) || (eVar2 = 0x1f6, l == 0xc0)) {
      local_40 = key;
      local_38 = certb;
      sVar3 = bignStart_keep(l,bakeBMQV_deep);
      in = (octet *)blobCreate(sVar3 + (l * 2 + 7 >> 3) + l +
                                       (l * 2 + 0x3f >> 2 & 0xfffffffffffffff0) + 0x220);
      if (in == (octet *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        uVar4 = params->l >> 1;
        poVar5 = in + uVar4;
        state = poVar5 + uVar4 + 8;
        eVar2 = bakeBMQVStart(state,params,settings,privkeya,certa);
        if ((((eVar2 == 0) && (eVar2 = (*read)(&local_48,in,params->l >> 1,file), eVar2 == 0)) &&
            ((eVar2 = bakeBMQVStep3(poVar5,in,local_38,state), eVar2 == 0 &&
             (eVar2 = (*write)(&local_48,poVar5,(params->l >> 1) + (ulong)(settings->kca != 0) * 8,
                               file), poVar5 = local_40, eVar2 == 0)))) &&
           ((settings->kcb == 0 ||
            ((eVar2 = (*read)(&local_48,in,8,file), eVar2 == 0 &&
             (eVar2 = bakeBMQVStep5(in,state), eVar2 == 0)))))) {
          eVar2 = bakeBMQVStepG(poVar5,state);
        }
        blobClose(in);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bakeBMQVRunA(octet key[32], const bign_params* params,
	const bake_settings* settings, const octet privkeya[],
	const bake_cert* certa, const bake_cert* certb,
	read_i read, write_i write, void* file)
{
	err_t code;
	size_t len;
	// блоб
	blob_t blob;
	octet* in;			/* [l / 2] */
	octet* out;			/* [l / 2 + 8] */
	void* state;		/* [bakeBMQV_keep()] */
	// проверить key
	if (!memIsValid(key, 32))
		return ERR_BAD_INPUT;
	// создать блоб
	if (params->l != 128 && params->l != 192 && params->l != 256)
		return ERR_BAD_PARAMS;
	blob = blobCreate(params->l + 8 + bakeBMQV_keep(params->l));
	if (blob == 0)
		return ERR_OUTOFMEMORY;
	// раскладка блоба
	in = (octet*)blob;
	out = in + params->l / 2;
	state = out + params->l / 2 + 8;
	// старт
	code = bakeBMQVStart(state, params, settings, privkeya, certa);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 3
	code = read(&len, in, params->l / 2, file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = bakeBMQVStep3(out, in, certb, state);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = write(&len, out, params->l / 2 + (settings->kca ? 8u : 0), file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 5
	if (settings->kcb)
	{
		code = read(&len, in, 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = bakeBMQVStep5(in, state);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// завершение
	code = bakeBMQVStepG(key, state);
	blobClose(blob);
	return code;
}